

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *stream,QJsonArray *array)

{
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QJsonDocument doc;
  QJsonArray *in_stack_ffffffffffffffa8;
  QJsonDocument *in_stack_ffffffffffffffc8;
  QJsonDocument *in_stack_ffffffffffffffd0;
  QJsonArray local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonDocument::QJsonDocument((QJsonDocument *)0x487cbe);
  operator>>(in_RSI,in_stack_ffffffffffffffd0);
  QJsonDocument::array(in_stack_ffffffffffffffc8);
  QJsonArray::operator=(&local_18,in_stack_ffffffffffffffa8);
  QJsonArray::~QJsonArray((QJsonArray *)0x487cfe);
  QJsonDocument::~QJsonDocument((QJsonDocument *)0x487d12);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QJsonArray &array)
{
    QJsonDocument doc;
    stream >> doc;
    array = doc.array();
    return stream;
}